

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Select * sqlite3ExprListToValues(Parse *pParse,int nElem,ExprList *pEList)

{
  byte *pbVar1;
  Expr *pEVar2;
  Select *pSVar3;
  Select *pSVar4;
  ExprList_item *pEVar5;
  uint uVar6;
  long lVar7;
  Select *local_48;
  
  if (pEList->nExpr < 1) {
    local_48 = (Select *)0x0;
  }
  else {
    pEVar5 = pEList->a;
    lVar7 = 0;
    local_48 = (Select *)0x0;
    do {
      pEVar2 = pEVar5->pExpr;
      uVar6 = 1;
      if (pEVar2->op == 0xb1) {
        uVar6 = ((pEVar2->x).pList)->nExpr;
      }
      pSVar3 = local_48;
      if (uVar6 == nElem) {
        pSVar4 = sqlite3SelectNew(pParse,(pEVar2->x).pList,(SrcList *)0x0,(Expr *)0x0,
                                  (ExprList *)0x0,(Expr *)0x0,(ExprList *)0x0,0x200,(Expr *)0x0);
        (pEVar2->x).pList = (ExprList *)0x0;
        if ((pSVar4 != (Select *)0x0) && (pSVar3 = pSVar4, local_48 != (Select *)0x0)) {
          pSVar4->op = 0x87;
          pSVar4->pPrior = local_48;
        }
      }
      else {
        sqlite3ErrorMsg(pParse,"IN(...) element has %d term%s - expected %d",(ulong)uVar6);
      }
      local_48 = pSVar3;
      if (uVar6 != nElem) break;
      lVar7 = lVar7 + 1;
      pEVar5 = pEVar5 + 1;
    } while (lVar7 < pEList->nExpr);
  }
  if ((local_48 != (Select *)0x0) && (local_48->pPrior != (Select *)0x0)) {
    pbVar1 = (byte *)((long)&local_48->selFlags + 1);
    *pbVar1 = *pbVar1 | 4;
  }
  exprListDeleteNN(pParse->db,pEList);
  return local_48;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3ExprListToValues(Parse *pParse, int nElem, ExprList *pEList){
  int ii;
  Select *pRet = 0;
  assert( nElem>1 );
  for(ii=0; ii<pEList->nExpr; ii++){
    Select *pSel;
    Expr *pExpr = pEList->a[ii].pExpr;
    int nExprElem;
    if( pExpr->op==TK_VECTOR ){
      assert( ExprUseXList(pExpr) );
      nExprElem = pExpr->x.pList->nExpr;
    }else{
      nExprElem = 1;
    }
    if( nExprElem!=nElem ){
      sqlite3ErrorMsg(pParse, "IN(...) element has %d term%s - expected %d",
          nExprElem, nExprElem>1?"s":"", nElem
      );
      break;
    }
    assert( ExprUseXList(pExpr) );
    pSel = sqlite3SelectNew(pParse, pExpr->x.pList, 0, 0, 0, 0, 0, SF_Values,0);
    pExpr->x.pList = 0;
    if( pSel ){
      if( pRet ){
        pSel->op = TK_ALL;
        pSel->pPrior = pRet;
      }
      pRet = pSel;
    }
  }

  if( pRet && pRet->pPrior ){
    pRet->selFlags |= SF_MultiValue;
  }
  sqlite3ExprListDelete(pParse->db, pEList);
  return pRet;
}